

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonPrintf(int N,JsonString *p,char *zFormat,...)

{
  char *pcVar1;
  u64 uVar2;
  char in_AL;
  int iVar3;
  size_t sVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_118 [24];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  sqlite3_str local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Da;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (p->nAlloc <= (long)N + p->nUsed) {
    iVar3 = jsonStringGrow(p,N);
    if (iVar3 != 0) goto LAB_001bc071;
  }
  puStack_40 = &stack0x00000008;
  local_48 = (undefined1 *)0x3000000018;
  pcVar1 = p->zBuf;
  uVar2 = p->nUsed;
  local_68.nChar = 0xaaaaaaaa;
  local_68.accError = 0xaa;
  local_68.printfFlags = 0xaa;
  local_68._30_2_ = 0xaaaa;
  local_38 = auStack_118;
  if (0 < N) {
    local_68.db = (sqlite3 *)0x0;
    local_68.mxAlloc = 0;
    local_68.nChar = 0;
    local_68.accError = '\0';
    local_68.printfFlags = '\0';
    local_68.zText = pcVar1 + uVar2;
    local_68.nAlloc = N;
    local_38 = auStack_118;
    sqlite3_str_vappendf(&local_68,zFormat,(__va_list_tag *)&local_48);
    (pcVar1 + uVar2)[local_68.nChar] = '\0';
  }
  uVar2 = p->nUsed;
  sVar4 = strlen(p->zBuf + uVar2);
  p->nUsed = (long)(int)sVar4 + uVar2;
LAB_001bc071:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonPrintf(int N, JsonString *p, const char *zFormat, ...){
  va_list ap;
  if( (p->nUsed + N >= p->nAlloc) && jsonStringGrow(p, N) ) return;
  va_start(ap, zFormat);
  sqlite3_vsnprintf(N, p->zBuf+p->nUsed, zFormat, ap);
  va_end(ap);
  p->nUsed += (int)strlen(p->zBuf+p->nUsed);
}